

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_paste_callback(void *vterm)

{
  ulong uVar1;
  long lVar2;
  char *__s;
  wchar_t wVar3;
  ulong uVar4;
  strbuf *buf_o;
  wchar_t len;
  wchar_t len_00;
  int iVar6;
  size_t sVar5;
  
  if (*(int *)((long)vterm + 0x10d8) != 0) {
    while( true ) {
      iVar6 = *(int *)((long)vterm + 0x10dc);
      if (*(int *)((long)vterm + 0x10d8) <= iVar6) break;
      len_00 = *(int *)((long)vterm + 0x10d8) - iVar6;
      uVar4 = 0;
      do {
        if ((uint)len_00 == uVar4) goto LAB_0010b296;
        uVar1 = uVar4 + 1;
        lVar2 = uVar4 * 4;
        uVar4 = uVar1;
      } while (*(int *)(*(long *)((long)vterm + 0x10d0) + (long)iVar6 * 4 + lVar2) != 0xd);
      len_00 = (wchar_t)uVar1;
LAB_0010b296:
      if (*(long *)((long)vterm + 0x10e8) != 0) {
        buf_o = term_input_data_from_unicode
                          ((Terminal *)vterm,
                           (wchar_t *)((long)iVar6 * 4 + *(long *)((long)vterm + 0x10d0)),len_00);
        __s = buf_o->s;
        len = (wchar_t)buf_o->len;
        if (*(char *)((long)vterm + 0x1bc) == '\x01') {
          wVar3 = len;
          if (len < L'\0') {
            sVar5 = strlen(__s);
            wVar3 = (wchar_t)sVar5;
          }
          bufchain_add((bufchain *)((long)vterm + 0xc0),__s,(long)wVar3);
          term_added_data((Terminal *)vterm,false);
        }
        if (*(Ldisc **)((long)vterm + 0x10e8) != (Ldisc *)0x0) {
          ldisc_send(*(Ldisc **)((long)vterm + 0x10e8),__s,len,false);
        }
        term_seen_key_event((Terminal *)vterm);
        strbuf_free(buf_o);
      }
      iVar6 = len_00 + *(int *)((long)vterm + 0x10dc);
      *(int *)((long)vterm + 0x10dc) = iVar6;
      if (iVar6 < *(int *)((long)vterm + 0x10d8)) {
        queue_toplevel_callback(term_paste_callback,vterm);
        return;
      }
    }
    if (*(char *)((long)vterm + 0x1d1) == '\x01') {
      if (*(Ldisc **)((long)vterm + 0x10e8) != (Ldisc *)0x0) {
        ldisc_send(*(Ldisc **)((long)vterm + 0x10e8),"\x1b[201~",L'\x06',false);
      }
      *(undefined1 *)((long)vterm + 0x1d1) = 0;
    }
    safefree(*(void **)((long)vterm + 0x10d0));
    *(undefined8 *)((long)vterm + 0x10d0) = 0;
    *(undefined4 *)((long)vterm + 0x10d8) = 0;
  }
  return;
}

Assistant:

static void term_paste_callback(void *vterm)
{
    Terminal *term = (Terminal *)vterm;

    if (term->paste_len == 0)
        return;

    while (term->paste_pos < term->paste_len) {
        int n = 0;
        while (n + term->paste_pos < term->paste_len) {
            if (term->paste_buffer[term->paste_pos + n++] == '\015')
                break;
        }
        if (term->ldisc) {
            strbuf *buf = term_input_data_from_unicode(
                term, term->paste_buffer + term->paste_pos, n);
            term_keyinput_internal(term, buf->s, buf->len, false);
            strbuf_free(buf);
        }
        term->paste_pos += n;

        if (term->paste_pos < term->paste_len) {
            queue_toplevel_callback(term_paste_callback, term);
            return;
        }
    }
    term_bracketed_paste_stop(term);
    sfree(term->paste_buffer);
    term->paste_buffer = NULL;
    term->paste_len = 0;
}